

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::DebugOutStream::DebugOutStream(DebugOutStream *this)

{
  streambuf *psVar1;
  
  (this->super_IStream)._vptr_IStream = (_func_int **)&PTR__DebugOutStream_0016cb78;
  psVar1 = (streambuf *)operator_new(0x148);
  *(code **)psVar1 = __assert_fail;
  *(undefined8 *)(psVar1 + 8) = 0;
  *(undefined8 *)(psVar1 + 0x10) = 0;
  *(undefined8 *)(psVar1 + 0x18) = 0;
  *(undefined8 *)(psVar1 + 0x20) = 0;
  *(undefined8 *)(psVar1 + 0x28) = 0;
  *(undefined8 *)(psVar1 + 0x30) = 0;
  std::locale::locale((locale *)(psVar1 + 0x38));
  *(undefined ***)psVar1 = &PTR__StreamBufImpl_0016eb68;
  *(streambuf **)(psVar1 + 0x28) = psVar1 + 0x40;
  *(streambuf **)(psVar1 + 0x20) = psVar1 + 0x40;
  *(streambuf **)(psVar1 + 0x30) = psVar1 + 0x140;
  (this->m_streamBuf)._M_ptr = (StreamBufBase *)psVar1;
  std::ostream::ostream(&this->m_os,psVar1);
  return;
}

Assistant:

DebugOutStream::DebugOutStream()
    :   m_streamBuf( new StreamBufImpl<OutputDebugWriter>() ),
        m_os( m_streamBuf.get() )
    {}